

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

TextureCubeView *
tcu::getEffectiveTView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  int *piVar1;
  pointer pCVar2;
  int iVar3;
  int faceNdx;
  long lVar4;
  long lVar5;
  long lVar6;
  ConstPixelBufferAccess *storagePtrs [6];
  ConstPixelBufferAccess local_90;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)(src->m_numLevels * 6));
  local_68 = (storage->
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = src->m_numLevels;
  local_60 = local_68 + iVar3;
  local_58 = local_68 + iVar3 * 2;
  local_50 = local_68 + iVar3 * 3;
  local_48 = local_68 + iVar3 * 4;
  local_40 = local_68 + iVar3 * 5;
  TextureCubeView::TextureCubeView
            (__return_storage_ptr__,iVar3,(ConstPixelBufferAccess *(*) [6])&local_68);
  lVar4 = 0;
  do {
    if (0 < src->m_numLevels) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        toSamplerAccess<tcu::ConstPixelBufferAccess>
                  (&local_90,
                   (ConstPixelBufferAccess *)
                   ((long)(src->m_levels[lVar4]->m_size).m_data + lVar6 + -8),
                   sampler->depthStencilMode);
        iVar3 = src->m_numLevels * (int)lVar4 + (int)lVar5;
        pCVar2 = (storage->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar2[iVar3].m_data = local_90.m_data;
        piVar1 = pCVar2[iVar3].m_size.m_data + 2;
        *(undefined8 *)piVar1 = local_90._16_8_;
        *(undefined8 *)(piVar1 + 2) = local_90.m_pitch.m_data._4_8_;
        pCVar2[iVar3].m_format = local_90.m_format;
        *(undefined8 *)pCVar2[iVar3].m_size.m_data = local_90.m_size.m_data._0_8_;
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x28;
      } while (lVar5 < src->m_numLevels);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return __return_storage_ptr__;
}

Assistant:

tcu::TextureCubeView getEffectiveTView (const tcu::TextureCubeView& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(tcu::CUBEFACE_LAST * src.getNumLevels());

	const tcu::ConstPixelBufferAccess* storagePtrs[tcu::CUBEFACE_LAST] =
	{
		&storage[0 * src.getNumLevels()],
		&storage[1 * src.getNumLevels()],
		&storage[2 * src.getNumLevels()],
		&storage[3 * src.getNumLevels()],
		&storage[4 * src.getNumLevels()],
		&storage[5 * src.getNumLevels()],
	};

	tcu::TextureCubeView view = tcu::TextureCubeView(src.getNumLevels(), storagePtrs);

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[faceNdx * src.getNumLevels() + levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), sampler.depthStencilMode);

	return view;
}